

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::executeInstruction(VM *this,Instruction *ins)

{
  OpCode OVar1;
  int iVar2;
  u4 uVar3;
  
  OVar1 = ins->op;
  if (OVar1 < i2d) {
    switch(OVar1) {
    case bipush:
    case ipush:
      uVar3 = ins->x;
      ensureStackRest(this,1);
      iVar2 = this->_sp;
      this->_sp = iVar2 + 1;
      (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl[iVar2] = uVar3;
      break;
    case pop:
      ensureStackUsed(this,1);
      this->_sp = this->_sp + -1;
      break;
    case pop2:
      ensureStackUsed(this,2);
      this->_sp = this->_sp + -2;
      break;
    case popn:
      uVar3 = ins->x;
      ensureStackUsed(this,uVar3);
      this->_sp = this->_sp - uVar3;
      break;
    case dup:
      DUP(this);
      return;
    case dup2:
      DUP2(this);
      return;
    case loadc:
      loadc(this,(u2)ins->x);
      return;
    case loada:
      loada(this,(u2)ins->x,ins->y);
      return;
    case _new:
      _new(this);
      return;
    case snew:
      uVar3 = ins->x;
      ensureStackRest(this,uVar3);
      this->_sp = this->_sp + uVar3;
      break;
    case iload:
    case aload:
      Tload<int>(this);
      return;
    case dload:
      Tload<double>(this);
      return;
    case iaload:
    case aaload:
      Taload<int>(this);
      return;
    case daload:
      Taload<double>(this);
      return;
    case istore:
    case astore:
      Tstore<int>(this);
      return;
    case dstore:
      Tstore<double>(this);
      return;
    case iastore:
    case aastore:
      Tastore<int>(this);
      return;
    case dastore:
      Tastore<double>(this);
      return;
    case iadd:
      Tadd<int>(this);
      return;
    case dadd:
      Tadd<double>(this);
      return;
    case isub:
      Tsub<int>(this);
      return;
    case dsub:
      Tsub<double>(this);
      return;
    case imul:
      Tmul<int>(this);
      return;
    case dmul:
      Tmul<double>(this);
      return;
    case idiv:
      Tdiv<int>(this);
      return;
    case ddiv:
      Tdiv<double>(this);
      return;
    case ineg:
      Tneg<int>(this);
      return;
    case dneg:
      Tneg<double>(this);
      return;
    case icmp:
      Tcmp<int>(this);
      return;
    case dcmp:
      Tcmp<double>(this);
      return;
    }
  }
  else {
    switch(OVar1) {
    case i2d:
      T2T<int,double>(this);
      return;
    case d2i:
      T2T<double,int>(this);
      return;
    case i2c:
      T2T<int,unsigned_char>(this);
      return;
    case i2c|bipush:
    case i2d|pop:
    case i2d|pop2:
    case i2d|popn:
    case i2d|dup:
    case i2d|dup2:
    case i2d|loadc:
    case i2d|loada:
    case i2d|_new:
    case i2d|snew:
    case i2d|snew|bipush:
    case i2d|snew|ipush:
    case i2d|snew|ipush|bipush:
      break;
    case jmp:
      JUMP(this,(u2)ins->x);
      return;
    case je:
      je(this,(u2)ins->x);
      return;
    case jne:
      jne(this,(u2)ins->x);
      return;
    case jl:
      jl(this,(u2)ins->x);
      return;
    case jge:
      jge(this,(u2)ins->x);
      return;
    case jg:
      jg(this,(u2)ins->x);
      return;
    case jle:
      jle(this,(u2)ins->x);
      return;
    default:
      switch(OVar1) {
      case iprint:
        Tprint<int>(this);
        return;
      case dprint:
        Tprint<double>(this);
        return;
      case cprint:
        Tprint<unsigned_char>(this);
        return;
      case sprint:
        sprint(this);
        return;
      case iprint|pop:
      case iprint|pop2:
      case iprint|popn:
      case iprint|dup:
      case iprint|dup2:
      case iprint|loadc:
      case iprint|loada:
      case iprint|_new:
      case iprint|snew:
      case iprint|snew|bipush:
      case iprint|snew|ipush:
        break;
      case printl:
        printl(this);
        return;
      case iscan:
        Tscan<int>(this);
        return;
      case dscan:
        Tscan<double>(this);
        return;
      case cscan:
        Tscan<unsigned_char>(this);
        return;
      default:
        switch(OVar1) {
        case call:
          CALL(this,(u2)ins->x);
          return;
        case ret:
          RET(this);
          return;
        case iret:
        case aret:
          Tret<int>(this);
          return;
        case dret:
          Tret<double>(this);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void VM::executeInstruction(const Instruction& ins) {
    //println(std::cout, "execute", ins);
    switch (ins.op)
    {
    case OpCode::nop: break;
    case OpCode::bipush:
    case OpCode::ipush:   ipush(ins.x); break;
    case OpCode::pop:     popn(1);      break;
    case OpCode::pop2:    popn(2);      break;
    case OpCode::popn:    popn(ins.x);  break;
    case OpCode::dup:     dup();        break;
    case OpCode::dup2:    dup2();       break;
    case OpCode::loadc:   loadc(ins.x); break;
    case OpCode::loada:   loada(ins.x, ins.y);break;
    case OpCode::_new:    _new();       break;
    case OpCode::snew:    snew(ins.x);  break;
    
    case OpCode::iload:   Tload<int_t>();      break;
    case OpCode::dload:   Tload<double_t>();   break;
    case OpCode::aload:   Tload<addr_t>();     break;
    case OpCode::iaload:  Taload<int_t>();     break;
    case OpCode::daload:  Taload<double_t>();  break;
    case OpCode::aaload:  Taload<addr_t>();    break;
    
    case OpCode::istore:  Tstore<int_t>();     break;
    case OpCode::dstore:  Tstore<double_t>();  break;
    case OpCode::astore:  Tstore<addr_t>();    break;
    case OpCode::iastore: Tastore<int_t>();    break;
    case OpCode::dastore: Tastore<double_t>(); break;
    case OpCode::aastore: Tastore<addr_t>();   break;
    
    case OpCode::iadd:    Tadd<int_t>();       break;
    case OpCode::dadd:    Tadd<double_t>();    break;
    case OpCode::isub:    Tsub<int_t>();       break;
    case OpCode::dsub:    Tsub<double_t>();    break;
    case OpCode::imul:    Tmul<int_t>();       break;
    case OpCode::dmul:    Tmul<double_t>();    break;
    case OpCode::idiv:    Tdiv<int_t>();       break;
    case OpCode::ddiv:    Tdiv<double_t>();    break;
    case OpCode::ineg:    Tneg<int_t>();       break;
    case OpCode::dneg:    Tneg<double_t>();    break;

    case OpCode::icmp:    Tcmp<int_t>();       break;
    case OpCode::dcmp:    Tcmp<double_t>();    break;
    
    case OpCode::i2d:     T2T<int_t, double_t>(); break;
    case OpCode::d2i:     T2T<double_t, int_t>(); break;
    case OpCode::i2c:     T2T<int_t, char_t>();   break;
    
    case OpCode::jmp:     jmp(ins.x);   break;
    case OpCode::je:      je(ins.x);    break;
    case OpCode::jne:     jne(ins.x);   break;
    case OpCode::jl:      jl(ins.x);    break;
    case OpCode::jge:     jge(ins.x);   break;
    case OpCode::jg:      jg(ins.x);    break;
    case OpCode::jle:     jle(ins.x);   break;

    case OpCode::call:    call(ins.x);      break;
    case OpCode::ret:     Tret<void>();     break;
    case OpCode::iret:    Tret<int_t>();    break;
    case OpCode::dret:    Tret<double_t>(); break;
    case OpCode::aret:    Tret<addr_t>();   break;

    case OpCode::iprint:  Tprint<int_t>();    break;
    case OpCode::dprint:  Tprint<double_t>(); break;
    case OpCode::cprint:  Tprint<char_t>();   break;
    case OpCode::sprint:  sprint();           break;
    case OpCode::printl:  printl();           break;
    case OpCode::iscan:   Tscan<int_t>();     break;
    case OpCode::dscan:   Tscan<double_t>();  break;
    case OpCode::cscan:   Tscan<char_t>();    break;
    default:
        break;
    }
}